

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::AddLogSink(LogSink *destination)

{
  iterator __position;
  vector<google::LogSink*,std::allocator<google::LogSink*>> *pvVar1;
  int iVar2;
  MutexLock l;
  MutexLock local_20;
  LogSink *local_18;
  
  local_20.mu_ = (Mutex *)LogDestination::sink_mutex_;
  local_18 = destination;
  if (LogDestination::sink_mutex_[0x38] == '\x01') {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
    if (iVar2 != 0) {
      abort();
    }
  }
  if (LogDestination::sinks_ == (vector<google::LogSink*,std::allocator<google::LogSink*>> *)0x0) {
    LogDestination::sinks_ =
         (vector<google::LogSink*,std::allocator<google::LogSink*>> *)operator_new(0x18);
    *(undefined8 *)LogDestination::sinks_ = 0;
    *(undefined8 *)(LogDestination::sinks_ + 8) = 0;
    *(undefined8 *)(LogDestination::sinks_ + 0x10) = 0;
  }
  pvVar1 = LogDestination::sinks_;
  __position._M_current = *(LogSink ***)(LogDestination::sinks_ + 8);
  if (__position._M_current == *(LogSink ***)(LogDestination::sinks_ + 0x10)) {
    std::vector<google::LogSink*,std::allocator<google::LogSink*>>::
    _M_realloc_insert<google::LogSink*const&>(LogDestination::sinks_,__position,&local_18);
  }
  else {
    *__position._M_current = destination;
    *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

void AddLogSink(LogSink *destination) {
  LogDestination::AddLogSink(destination);
}